

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::print_features(vw *all,example *ec)

{
  byte bVar1;
  byte *pbVar2;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  float *pfVar4;
  pointer psVar5;
  byte *pbVar6;
  ostream *poVar7;
  float *pfVar8;
  pointer psVar9;
  unsigned_long *puVar10;
  long lVar11;
  audit_results dat;
  
  if (all->lda == 0) {
    dat.offset = (ec->super_example_predict).ft_offset;
    dat.ns_pre.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dat.ns_pre.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dat.ns_pre.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dat.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    dat.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    dat.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pbVar2 = (ec->super_example_predict).indices._end;
    dat.all = all;
    for (pbVar6 = (ec->super_example_predict).indices._begin; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1)
    {
      bVar1 = *pbVar6;
      psVar3 = (ec->super_example_predict).feature_space[bVar1].space_names._begin;
      pfVar8 = (ec->super_example_predict).feature_space[bVar1].values._begin;
      pfVar4 = (ec->super_example_predict).feature_space[bVar1].values._end;
      puVar10 = (ec->super_example_predict).feature_space[bVar1].indicies._begin;
      if ((ec->super_example_predict).feature_space[bVar1].space_names._end == psVar3) {
        for (; pfVar8 != pfVar4; pfVar8 = pfVar8 + 1) {
          audit_feature(&dat,*pfVar8,(ec->super_example_predict).ft_offset + *puVar10);
          puVar10 = puVar10 + 1;
        }
      }
      else {
        for (lVar11 = 0; (float *)((long)pfVar8 + lVar11) != pfVar4; lVar11 = lVar11 + 4) {
          audit_interaction(&dat,*(audit_strings **)
                                  ((long)&(psVar3->
                                          super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + lVar11 * 4));
          audit_feature(&dat,*(float *)((long)pfVar8 + lVar11),
                        (ec->super_example_predict).ft_offset +
                        *(long *)((long)puVar10 + lVar11 * 2));
          audit_interaction(&dat,(audit_strings *)0x0);
        }
      }
    }
    INTERACTIONS::
    generate_interactions<GD::audit_results,_const_unsigned_long,_&GD::audit_feature,_true,_&GD::audit_interaction>
              (all,&ec->super_example_predict,&dat);
    std::
    __stable_sort<__gnu_cxx::__normal_iterator<GD::string_value*,std::vector<GD::string_value,std::allocator<GD::string_value>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (dat.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>.
               _M_impl.super__Vector_impl_data._M_start,
               dat.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    psVar5 = dat.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    psVar9 = dat.results.super__Vector_base<GD::string_value,_std::allocator<GD::string_value>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (all->audit == true) {
      for (; psVar9 != psVar5; psVar9 = psVar9 + 1) {
        poVar7 = std::operator<<((ostream *)&std::cout,'\t');
        std::operator<<(poVar7,(string *)&psVar9->s);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    audit_results::~audit_results(&dat);
    return;
  }
  print_lda_features(all,ec);
  return;
}

Assistant:

void print_features(vw& all, example& ec)
{
  if (all.lda > 0)
    print_lda_features(all, ec);
  else
  {
    audit_results dat(all, ec.ft_offset);

    for (features& fs : ec)
    {
      if (fs.space_names.size() > 0)
        for (features::iterator_all& f : fs.values_indices_audit())
        {
          audit_interaction(dat, f.audit().get());
          audit_feature(dat, f.value(), f.index() + ec.ft_offset);
          audit_interaction(dat, NULL);
        }
      else
        for (features::iterator& f : fs) audit_feature(dat, f.value(), f.index() + ec.ft_offset);
    }

    INTERACTIONS::generate_interactions<audit_results, const uint64_t, audit_feature, true, audit_interaction>(
        all, ec, dat);

    stable_sort(dat.results.begin(), dat.results.end());
    if (all.audit)
    {
      for (string_value& sv : dat.results) cout << '\t' << sv.s;
      cout << endl;
    }
  }
}